

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O2

void __thiscall Diligent::FixedBlockMemoryAllocator::Free(FixedBlockMemoryAllocator *this,void *Ptr)

{
  char (*pacVar1) [27];
  iterator __it;
  pointer pvVar2;
  char (*Args_1) [27];
  string msg;
  unsigned_long PageId;
  string local_58;
  char (*local_38) [27];
  void *local_30;
  
  local_30 = Ptr;
  std::mutex::lock(&this->m_Mutex);
  __it = std::
         _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->m_AddrToPageId)._M_h,&local_30);
  if (__it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    FormatString<char[67]>
              (&local_58,
               (char (*) [67])"Address not found in the allocations list - double freeing memory?");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x102);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    pacVar1 = *(char (**) [27])
               ((long)__it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>.
                      _M_cur + 0x10);
    pvVar2 = (this->m_PagePool).
             super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Args_1 = (char (*) [27])
             ((long)(this->m_PagePool).
                    super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 5);
    local_38 = pacVar1;
    if (Args_1 <= pacVar1) {
      FormatString<char[26],char[27]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"PageId < m_PagePool.size()",Args_1);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0xf3);
      std::__cxx11::string::~string((string *)&local_58);
      pvVar2 = (this->m_PagePool).
               super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    MemoryPage::DeAllocate(pvVar2 + (long)pacVar1,local_30);
    std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->m_AvailablePages,(value_type *)&local_38);
    std::
    _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->m_AddrToPageId)._M_h,
            (const_iterator)
            __it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void FixedBlockMemoryAllocator::Free(void* Ptr)
{
    std::lock_guard<std::mutex> LockGuard(m_Mutex);
    auto                        PageIdIt = m_AddrToPageId.find(Ptr);
    if (PageIdIt != m_AddrToPageId.end())
    {
        auto PageId = PageIdIt->second;
        VERIFY_EXPR(PageId < m_PagePool.size());
        m_PagePool[PageId].DeAllocate(Ptr);
        m_AvailablePages.insert(PageId);
        m_AddrToPageId.erase(PageIdIt);
        if (m_AvailablePages.size() > 1 && !m_PagePool[PageId].HasAllocations())
        {
            // In current implementation pages are never released!
            // Note that if we delete a page, all indices past it will be invalid

            //m_PagePool.erase(m_PagePool.begin() + PageId);
            //m_AvailablePages.erase(PageId);
        }
    }
    else
    {
        UNEXPECTED("Address not found in the allocations list - double freeing memory?");
    }
}